

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_heap.cpp
# Opt level: O3

bool __thiscall
ON_SubDHeap::Internal_InitializeFragmentCountEstimates(ON_SubDHeap *this,uint subd_display_density)

{
  bool bVar1;
  ushort uVar2;
  ushort uVar3;
  ON_SubDComponentBase *this_00;
  uint uVar4;
  uint uVar5;
  ON_SubDFace *f;
  ON_FixedSizePoolIterator fspfit;
  ON_FixedSizePoolIterator OStack_48;
  
  uVar4 = this->m_full_fragment_display_density;
  if (uVar4 == 0) {
    uVar4 = 6;
    if (subd_display_density < 6) {
      uVar4 = subd_display_density;
    }
    uVar5 = 1;
    if (subd_display_density != 0) {
      uVar5 = uVar4;
    }
    this->m_full_fragment_display_density = uVar5;
    ON_FixedSizePoolIterator::ON_FixedSizePoolIterator(&OStack_48,&this->m_fspf);
    this_00 = (ON_SubDComponentBase *)ON_FixedSizePoolIterator::FirstElement(&OStack_48);
    if (this_00 == (ON_SubDComponentBase *)0x0) {
      uVar5 = 0;
      uVar4 = 0;
    }
    else {
      uVar4 = 0;
      uVar5 = 0;
      do {
        bVar1 = ON_SubDComponentBase::IsActive(this_00);
        if (bVar1) {
          uVar2 = (ushort)*(undefined4 *)((long)&this_00[1].m_symmetry_set_next.m_ptr + 4);
          uVar3 = uVar2;
          if (uVar2 == 4) {
            uVar3 = 0;
          }
          uVar5 = uVar5 + (uVar2 == 4);
          uVar4 = uVar4 + uVar3;
        }
        this_00 = (ON_SubDComponentBase *)ON_FixedSizePoolIterator::NextElement(&OStack_48);
      } while (this_00 != (ON_SubDComponentBase *)0x0);
    }
    this->m_full_fragment_count_estimate = uVar5;
    this->m_part_fragment_count_estimate = uVar4;
    uVar4 = this->m_full_fragment_display_density;
  }
  return uVar4 - 1 < 6;
}

Assistant:

bool ON_SubDHeap::Internal_InitializeFragmentCountEstimates(
  unsigned subd_display_density
)
{
  if (0 == m_full_fragment_display_density)
  {
    m_full_fragment_display_density 
      = subd_display_density > 0 
      ? (subd_display_density <= ON_SubDDisplayParameters::MaximumDensity ? subd_display_density : ON_SubDDisplayParameters::MaximumDensity)
      : 1U
      ;

    // Count the number of active faces and fragments needed to mesh them
    unsigned subd_face_count = 0;
    unsigned full_frag_count = 0;
    unsigned part_frag_count = 0;

    ON_FixedSizePoolIterator fspfit(m_fspf);
    for (const void* p = fspfit.FirstElement(); nullptr != p; p = fspfit.NextElement())
    {
      const ON_SubDFace* f = (const ON_SubDFace*)p;
      if (false == f->IsActive())
        continue;
      ++subd_face_count;
      if (4 == f->m_edge_count)
        ++full_frag_count; // one full fragment per quad
      else
        part_frag_count += f->m_edge_count; // n partial fragments per n-gon when n != 4
    }

    if (full_frag_count > 0 || part_frag_count > 0)
    {
      m_full_fragment_count_estimate = full_frag_count;
      m_part_fragment_count_estimate = part_frag_count;
    }
    else
    {
      m_full_fragment_count_estimate = 0;
      m_part_fragment_count_estimate = 0;
    }
  }

  return (m_full_fragment_display_density > 0 && m_full_fragment_display_density <= ON_SubDDisplayParameters::MaximumDensity);
}